

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_Minify(char *json)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  char *into;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar4 = (byte *)json;
  if (json != (char *)0x0) {
LAB_001086b4:
    bVar1 = *pbVar4;
    uVar3 = (ulong)bVar1;
    if (uVar3 < 0x30) {
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0x22) goto LAB_00108705;
        if (uVar3 != 0x2f) goto LAB_001086f7;
        if (pbVar4[1] == 0x2a) {
          pbVar4 = pbVar4 + 2;
          do {
            if (*pbVar4 == 0x2a) {
              if (pbVar4[1] == 0x2f) {
                pbVar4 = pbVar4 + 2;
                goto LAB_001086b4;
              }
            }
            else if (*pbVar4 == 0) goto LAB_001086b4;
            pbVar4 = pbVar4 + 1;
          } while( true );
        }
        if (pbVar4[1] == 0x2f) {
          for (pbVar4 = pbVar4 + 2; *pbVar4 != 0; pbVar4 = pbVar4 + 1) {
            if (*pbVar4 == 10) goto LAB_001086c3;
          }
        }
      }
      else {
LAB_001086c3:
        pbVar4 = pbVar4 + 1;
      }
      goto LAB_001086b4;
    }
LAB_001086f7:
    if (bVar1 != 0) {
      *json = bVar1;
      goto LAB_001086fd;
    }
    *json = 0;
  }
  return;
LAB_00108705:
  *json = bVar1;
  do {
    while( true ) {
      pbVar5 = pbVar4;
      pbVar2 = (byte *)json;
      json = (char *)(pbVar2 + 1);
      pbVar4 = pbVar5 + 1;
      if (pbVar5[1] == 0) goto LAB_001086b4;
      *json = pbVar5[1];
      if (*pbVar4 != 0x5c) break;
      if (pbVar5[2] == 0x22) {
        pbVar2[2] = 0x22;
        json = (char *)(pbVar2 + 2);
        pbVar4 = pbVar5 + 2;
      }
    }
  } while (*pbVar4 != 0x22);
  *json = 0x22;
LAB_001086fd:
  json = (char *)((byte *)json + 1);
  pbVar4 = pbVar4 + 1;
  goto LAB_001086b4;
}

Assistant:

CJSON_PUBLIC(void) cJSON_Minify(char *json)
{
    char *into = json;

    if (json == NULL)
    {
        return;
    }

    while (json[0] != '\0')
    {
        switch (json[0])
        {
            case ' ':
            case '\t':
            case '\r':
            case '\n':
                json++;
                break;

            case '/':
                if (json[1] == '/')
                {
                    skip_oneline_comment(&json);
                }
                else if (json[1] == '*')
                {
                    skip_multiline_comment(&json);
                }
                break;

            case '\"':
                minify_string(&json, (char**)&into);
                break;

            default:
                into[0] = json[0];
                json++;
                into++;
        }
    }

    /* and null-terminate. */
    *into = '\0';
}